

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int Symbol_insert(symbol *data,char *key)

{
  symbol **ppsVar1;
  uint uVar2;
  s_x2node *__ptr;
  char *x;
  size_t __nmemb;
  s_x2 *psVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  s_x2node *psVar7;
  ulong uVar8;
  ulong uVar9;
  symbol *psVar10;
  rule *prVar11;
  rule **pprVar12;
  int iVar13;
  long lVar14;
  s_x2node *psVar15;
  
  psVar3 = x2a;
  if (x2a != (s_x2 *)0x0) {
    uVar4 = strhash(key);
    iVar13 = psVar3->size;
    uVar8 = (ulong)(iVar13 - 1U & uVar4);
    psVar15 = (s_x2node *)psVar3->ht;
    pprVar12 = (rule **)(&psVar15->data + uVar8);
    do {
      prVar11 = *pprVar12;
      if (prVar11 == (rule *)0x0) {
        uVar2 = psVar3->count;
        if ((int)uVar2 < iVar13) {
          psVar7 = psVar3->tbl;
        }
        else {
          __nmemb = (long)iVar13 * 2;
          psVar7 = (s_x2node *)calloc(__nmemb,0x28);
          if (psVar7 == (s_x2node *)0x0) {
            return 0;
          }
          psVar15 = psVar7 + (long)iVar13 * 2;
          uVar8 = 0;
          iVar13 = (int)__nmemb;
          uVar9 = 0;
          if (0 < iVar13) {
            uVar9 = __nmemb & 0xffffffff;
          }
          for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
            (&psVar15->data)[uVar8] = (symbol *)0x0;
          }
          lVar14 = 0;
          uVar8 = 0;
          if (0 < (int)uVar2) {
            uVar8 = (ulong)uVar2;
          }
          for (; __ptr = psVar3->tbl, uVar8 * 0x20 != lVar14; lVar14 = lVar14 + 0x20) {
            x = *(char **)((long)&__ptr->key + lVar14);
            uVar6 = strhash(x);
            ppsVar1 = &psVar15->data + (uVar6 & iVar13 - 1U);
            if (*ppsVar1 == (symbol *)0x0) {
              psVar10 = (symbol *)0x0;
            }
            else {
              (*ppsVar1)->fallback = (symbol *)((long)&psVar7->next + lVar14);
              psVar10 = *ppsVar1;
            }
            *(symbol **)((long)&psVar7->next + lVar14) = psVar10;
            *(char **)((long)&psVar7->key + lVar14) = x;
            *(undefined8 *)((long)&psVar7->data + lVar14) =
                 *(undefined8 *)((long)&__ptr->data + lVar14);
            *(symbol ***)((long)&psVar7->from + lVar14) = ppsVar1;
            *ppsVar1 = (symbol *)((long)&psVar7->data + lVar14);
          }
          free(__ptr);
          psVar3->size = iVar13;
          psVar3->tbl = psVar7;
          psVar3->ht = (s_x2node **)psVar15;
          uVar8 = (ulong)(iVar13 - 1U & uVar4);
        }
        psVar3->count = uVar2 + 1;
        psVar10 = (symbol *)(psVar7 + (int)uVar2);
        psVar7[(int)uVar2].key = key;
        psVar7[(int)uVar2].data = data;
        if ((&psVar15->data)[uVar8] == (symbol *)0x0) {
          prVar11 = (rule *)0x0;
        }
        else {
          (&psVar15->data)[uVar8]->fallback = (symbol *)&psVar10->rule;
          prVar11 = (rule *)(&psVar15->data)[uVar8];
        }
        psVar10->rule = prVar11;
        (&psVar15->data)[uVar8] = psVar10;
        psVar10->fallback = (symbol *)(psVar3->ht + uVar8);
        return 1;
      }
      iVar5 = strcmp(prVar11->lhsalias,key);
      pprVar12 = (rule **)&prVar11->lhsStart;
    } while (iVar5 != 0);
  }
  return 0;
}

Assistant:

int Symbol_insert(struct symbol *data, const char *key)
{
  x2node *np;
  unsigned h;
  unsigned ph;

  if( x2a==0 ) return 0;
  ph = strhash(key);
  h = ph & (x2a->size-1);
  np = x2a->ht[h];
  while( np ){
    if( strcmp(np->key,key)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x2a->count>=x2a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x2 array;
    array.size = size = x2a->size*2;
    array.count = x2a->count;
    array.tbl = (x2node*)calloc(size, sizeof(x2node) + sizeof(x2node*));
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x2node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x2a->count; i++){
      x2node *oldnp, *newnp;
      oldnp = &(x2a->tbl[i]);
      h = strhash(oldnp->key) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->key = oldnp->key;
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x2a->tbl);
    *x2a = array;
  }
  /* Insert the new data */
  h = ph & (x2a->size-1);
  np = &(x2a->tbl[x2a->count++]);
  np->key = key;
  np->data = data;
  if( x2a->ht[h] ) x2a->ht[h]->from = &(np->next);
  np->next = x2a->ht[h];
  x2a->ht[h] = np;
  np->from = &(x2a->ht[h]);
  return 1;
}